

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flecs.hpp
# Opt level: O2

void flecs::_::name_util::trim_name(char *typeName)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  uint uVar4;
  
  sVar2 = strlen(typeName);
  uVar4 = (uint)sVar2;
  if ((int)uVar4 < 7) goto LAB_00104951;
  iVar1 = strncmp(typeName,"const ",6);
  if (iVar1 == 0) {
    uVar4 = uVar4 - 6;
    memmove(typeName,typeName + 6,(ulong)uVar4);
    typeName[uVar4] = '\0';
  }
  if (uVar4 < 8) {
LAB_0010491d:
    if (uVar4 < 7) goto LAB_00104951;
  }
  else {
    iVar1 = strncmp(typeName,"struct ",7);
    if (iVar1 == 0) {
      uVar4 = uVar4 - 7;
      memmove(typeName,typeName + 7,(ulong)uVar4);
      typeName[uVar4] = '\0';
      goto LAB_0010491d;
    }
  }
  iVar1 = strncmp(typeName,"class ",6);
  if (iVar1 == 0) {
    uVar4 = uVar4 - 6;
    memmove(typeName,typeName + 6,(ulong)uVar4);
    typeName[uVar4] = '\0';
  }
LAB_00104951:
  uVar3 = (ulong)(int)uVar4;
  while (((ulong)(byte)typeName[uVar3 - 1] < 0x2b &&
         ((0x44100000000U >> ((ulong)(byte)typeName[uVar3 - 1] & 0x3f) & 1) != 0))) {
    typeName[uVar3 - 1] = '\0';
    uVar3 = uVar3 - 1;
  }
  if (6 < (long)uVar3) {
    iVar1 = strncmp(typeName + ((uVar3 & 0xffffffff) - 6)," const",6);
    if (iVar1 == 0) {
      typeName[(uVar3 & 0xffffffff) - 6] = '\0';
    }
  }
  return;
}

Assistant:

static void trim_name(char *typeName) {
            ecs_size_t len = ecs_os_strlen(typeName);
            
            /* Remove 'const' */
            ecs_size_t const_len = ecs_os_strlen("const ");
            if ((len > const_len) && !ecs_os_strncmp(typeName, "const ", const_len)) {
                ecs_os_memmove(typeName, typeName + const_len, len - const_len);
                typeName[len - const_len] = '\0';
                len -= const_len;
            }

            /* Remove 'struct' */
            ecs_size_t struct_len = ecs_os_strlen("struct ");
            if ((len > struct_len) && !ecs_os_strncmp(typeName, "struct ", struct_len)) {
                ecs_os_memmove(typeName, typeName + struct_len, len - struct_len);
                typeName[len - struct_len] = '\0';
                len -= struct_len;
            }

            /* Remove 'class' */
            ecs_size_t class_len = ecs_os_strlen("class ");
            if ((len > class_len) && !ecs_os_strncmp(typeName, "class ", class_len)) {
                ecs_os_memmove(typeName, typeName + class_len, len - class_len);
                typeName[len - class_len] = '\0';
                len -= class_len;
            }            

            while (typeName[len - 1] == ' ' ||
                   typeName[len - 1] == '&' ||
                   typeName[len - 1] == '*') 
            {
                len --;
                typeName[len] = '\0';
            }

            /* Remove const at end of string */
            if (len > const_len) {
                if (!ecs_os_strncmp(&typeName[len - const_len], " const", const_len)) {
                    typeName[len - const_len] = '\0';
                }
            }
        }